

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::VariableExpr::VariableExpr(VariableExpr *this,Location *location,string *n)

{
  Expression::Expression(&this->super_Expression,location);
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_do_evaluate_0022f308;
  std::__cxx11::string::string((string *)&this->name,(string *)n);
  return;
}

Assistant:

VariableExpr(const Location & location, const std::string& n)
      : Expression(location), name(n) {}